

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O0

void Llb_ManPrepareVarMap(Llb_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pObj;
  int iVarLo;
  int iVarLi;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Llb_Man_t *p_local;
  
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x31,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x32,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Cs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x33,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vGlo2Ns == (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntSize(p->vVar2Obj);
    pVVar4 = Vec_IntStartFull(iVar1);
    p->vNs2Glo = pVVar4;
    iVar1 = Vec_IntSize(p->vVar2Obj);
    pVVar4 = Vec_IntStartFull(iVar1);
    p->vCs2Glo = pVVar4;
    iVar1 = Aig_ManRegNum(p->pAig);
    pVVar4 = Vec_IntStartFull(iVar1);
    p->vGlo2Cs = pVVar4;
    iVar1 = Aig_ManRegNum(p->pAig);
    pVVar4 = Vec_IntStartFull(iVar1);
    p->vGlo2Ns = pVVar4;
    iVarLo = 0;
    while( true ) {
      iVar1 = Saig_ManRegNum(p->pAig);
      if (iVar1 <= iVarLo) {
        for (iVarLo = 0; iVar1 = Saig_ManPiNum(p->pAig), iVarLo < iVar1; iVarLo = iVarLo + 1) {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iVarLo);
          pVVar4 = p->vObj2Var;
          iVar1 = Aig_ObjId(pAVar5);
          iVar1 = Vec_IntEntry(pVVar4,iVar1);
          pVVar4 = p->vCs2Glo;
          iVar3 = Aig_ManRegNum(p->pAig);
          Vec_IntWriteEntry(pVVar4,iVar1,iVar3 + iVarLo);
          pVVar4 = p->vNs2Glo;
          iVar3 = Aig_ManRegNum(p->pAig);
          Vec_IntWriteEntry(pVVar4,iVar1,iVar3 + iVarLo);
        }
        return;
      }
      pAVar5 = Saig_ManLi(p->pAig,iVarLo);
      pObj = Saig_ManLo(p->pAig,iVarLo);
      pVVar4 = p->vObj2Var;
      iVar1 = Aig_ObjId(pAVar5);
      iVar1 = Vec_IntEntry(pVVar4,iVar1);
      pVVar4 = p->vObj2Var;
      iVar3 = Aig_ObjId(pObj);
      iVar3 = Vec_IntEntry(pVVar4,iVar3);
      if ((iVar1 < 0) || (iVar2 = Vec_IntSize(p->vVar2Obj), iVar2 <= iVar1)) break;
      if ((iVar3 < 0) || (iVar2 = Vec_IntSize(p->vVar2Obj), iVar2 <= iVar3)) {
        __assert_fail("iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                      ,0x3e,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
      }
      Vec_IntWriteEntry(p->vNs2Glo,iVar1,iVarLo);
      Vec_IntWriteEntry(p->vCs2Glo,iVar3,iVarLo);
      Vec_IntWriteEntry(p->vGlo2Cs,iVarLo,iVar3);
      Vec_IntWriteEntry(p->vGlo2Ns,iVarLo,iVar1);
      iVarLo = iVarLo + 1;
    }
    __assert_fail("iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x3d,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  __assert_fail("p->vGlo2Ns == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                ,0x34,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_ManPrepareVarMap( Llb_Man_t * p )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    int i, iVarLi, iVarLo;
    assert( p->vNs2Glo == NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vNs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vCs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
    {
        iVarLi = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLi));
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        assert( iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj) );
        assert( iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj) );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLi, i );
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarLo );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarLi );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObjLo, i )
    {
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
    }
}